

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteCamera(ColladaExporter *this,size_t pIndex)

{
  char *__s;
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  aiCamera *paVar4;
  ostream *poVar5;
  string cameraId;
  string cameraName;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_48;
  
  paVar4 = this->mScene->mCameras[pIndex];
  __s = (paVar4->mName).data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,__s,(allocator<char> *)&local_68);
  XMLEscape(&local_48,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_89);
  XMLIDEncode(&local_88,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  puVar1 = &this->field_0x38;
  psVar2 = &this->startstr;
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<camera id=\"");
  poVar5 = std::operator<<(poVar5,(string *)&local_88);
  poVar5 = std::operator<<(poVar5,"-camera\" name=\"");
  poVar5 = std::operator<<(poVar5,(string *)&local_48);
  poVar5 = std::operator<<(poVar5,"\" >");
  psVar3 = &this->endstr;
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<optics>");
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<technique_common>");
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<perspective>");
  std::operator<<(poVar5,(string *)psVar3);
  PushTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<xfov sid=\"xfov\">");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar4->mHorizontalFOV * 57.29578);
  poVar5 = std::operator<<(poVar5,"</xfov>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<aspect_ratio>");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar4->mAspect);
  poVar5 = std::operator<<(poVar5,"</aspect_ratio>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<znear sid=\"znear\">");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar4->mClipPlaneNear);
  poVar5 = std::operator<<(poVar5,"</znear>");
  std::operator<<(poVar5,(string *)psVar3);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"<zfar sid=\"zfar\">");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,paVar4->mClipPlaneFar);
  poVar5 = std::operator<<(poVar5,"</zfar>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</perspective>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</technique_common>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</optics>");
  std::operator<<(poVar5,(string *)psVar3);
  PopTag(this);
  poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
  poVar5 = std::operator<<(poVar5,"</camera>");
  std::operator<<(poVar5,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void ColladaExporter::WriteCamera(size_t pIndex){

    const aiCamera *cam = mScene->mCameras[pIndex];
    const std::string cameraName = XMLEscape(cam->mName.C_Str());
    const std::string cameraId = XMLIDEncode(cam->mName.C_Str());

    mOutput << startstr << "<camera id=\"" << cameraId << "-camera\" name=\"" << cameraName << "\" >" << endstr;
    PushTag();
    mOutput << startstr << "<optics>" << endstr;
    PushTag();
    mOutput << startstr << "<technique_common>" << endstr;
    PushTag();
    //assimp doesn't support the import of orthographic cameras! se we write
    //always perspective
    mOutput << startstr << "<perspective>" << endstr;
    PushTag();
    mOutput << startstr << "<xfov sid=\"xfov\">"<<
                                AI_RAD_TO_DEG(cam->mHorizontalFOV)
                        <<"</xfov>" << endstr;
    mOutput << startstr << "<aspect_ratio>"
                        <<      cam->mAspect
                        << "</aspect_ratio>" << endstr;
    mOutput << startstr << "<znear sid=\"znear\">"
                        <<      cam->mClipPlaneNear
                        <<  "</znear>" << endstr;
    mOutput << startstr << "<zfar sid=\"zfar\">"
                        <<      cam->mClipPlaneFar
                        << "</zfar>" << endstr;
    PopTag();
    mOutput << startstr << "</perspective>" << endstr;
    PopTag();
    mOutput << startstr << "</technique_common>" << endstr;
    PopTag();
    mOutput << startstr << "</optics>" << endstr;
    PopTag();
    mOutput << startstr << "</camera>" << endstr;

}